

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int multiSelect(Parse *pParse,Select *p,SelectDest *pDest)

{
  sqlite3 *psVar1;
  Select *pSVar2;
  undefined8 uVar3;
  ulong uVar4;
  LogEst LVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iReg;
  int iVar10;
  char *pcVar11;
  char *pcVar12;
  Parse *pParse_00;
  Select *pSVar13;
  KeyInfo *p_00;
  CollSeq *pCVar14;
  undefined8 *in_RDX;
  Select *in_RSI;
  Parse *in_RDI;
  int addr_3;
  int nCol;
  CollSeq **apColl;
  Select *pLoop;
  KeyInfo *pKeyInfo;
  int i;
  int r1;
  SelectDest intersectdest;
  int addr_2;
  Expr *pLimit_1;
  int iStart_1;
  int iBreak_1;
  int iCont_1;
  int tab2;
  int tab1;
  int iStart;
  int iBreak;
  int iCont;
  SelectDest uniondest;
  int addr_1;
  Expr *pLimit;
  int priorOp;
  u8 op;
  int unionTab;
  int nLimit;
  int addr;
  sqlite3 *db;
  Select *pDelete;
  SelectDest dest;
  Vdbe *v;
  Select *pPrior;
  Select *in_stack_00000150;
  int rc;
  int in_stack_fffffffffffffe88;
  u32 in_stack_fffffffffffffe8c;
  int in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe94;
  int in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  sqlite3 *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  Parse *in_stack_fffffffffffffeb0;
  Select *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  CollSeq **local_120;
  Select *local_118;
  int local_108;
  SelectDest local_100;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  Select *in_stack_ffffffffffffff28;
  Expr *pEVar15;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  int in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  u8 in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff51;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff68;
  uint eDest;
  u8 local_75;
  int in_stack_ffffffffffffff90;
  undefined8 local_58;
  undefined4 local_50;
  undefined4 uStack_4c;
  SelectDest *pDest_00;
  Parse *pPVar16;
  int local_24;
  
  local_24 = 0;
  psVar1 = in_RDI->db;
  pSVar2 = in_RSI->pPrior;
  local_58 = *in_RDX;
  uVar3 = in_RDX[1];
  pDest_00 = (SelectDest *)in_RDX[2];
  pSVar13 = (Select *)in_RDX[3];
  if ((pSVar2->pOrderBy != (ExprList *)0x0) || (pSVar2->pLimit != (Expr *)0x0)) {
    pcVar11 = "LIMIT";
    if (pSVar2->pOrderBy != (ExprList *)0x0) {
      pcVar11 = "ORDER BY";
    }
    pcVar12 = selectOpName((uint)in_RSI->op);
    sqlite3ErrorMsg(in_RDI,"%s clause should come after %s not before",pcVar11,pcVar12);
    local_24 = 1;
    goto LAB_001b31c7;
  }
  pParse_00 = (Parse *)sqlite3GetVdbe((Parse *)CONCAT44(in_stack_fffffffffffffe8c,
                                                        in_stack_fffffffffffffe88));
  if ((byte)local_58 == '\f') {
    sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                      in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88,0);
    uVar4 = (ulong)local_58 >> 8;
    local_58 = CONCAT71((int7)uVar4,0xe);
  }
  if ((in_RSI->selFlags & 0x400) != 0) {
    local_24 = multiSelectValues(in_stack_fffffffffffffeb0,
                                 (Select *)
                                 CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                                 (SelectDest *)in_stack_fffffffffffffea0);
    goto LAB_001b31c7;
  }
  if ((in_RSI->selFlags & 0x2000) == 0) {
    if (in_RSI->pOrderBy != (ExprList *)0x0) {
      iVar6 = multiSelectOrderBy(pParse_00,pSVar13,pDest_00);
      return iVar6;
    }
    if (pSVar2->pPrior == (Select *)0x0) {
      sqlite3VdbeExplain(in_RDI,'\x01',"COMPOUND QUERY");
      sqlite3VdbeExplain(in_RDI,'\x01',"LEFT-MOST SUBQUERY");
    }
    uVar7 = (uint)in_RSI->op;
    if (uVar7 == 0x7b) {
LAB_001b288e:
      eDest = 1;
      if ((byte)local_58 == 1) {
      }
      else {
        local_58._4_4_ = in_RDI->nTab;
        in_RDI->nTab = local_58._4_4_ + 1;
        iVar6 = sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_fffffffffffffe94,
                                                   in_stack_fffffffffffffe90),
                                  in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88,0);
        in_RSI->addrOpenEphm[0] = iVar6;
        pSVar13 = findRightmost(in_RSI);
        pSVar13->selFlags = pSVar13->selFlags | 0x20;
      }
      sqlite3SelectDestInit((SelectDest *)&stack0xffffffffffffff50,eDest,local_58._4_4_);
      local_24 = sqlite3Select((Parse *)pDest,in_stack_00000150,(SelectDest *)pPrior);
      if (local_24 != 0) goto LAB_001b31c7;
      if (in_RSI->op == '}') {
        local_75 = '\x02';
      }
      else {
        local_75 = '\x01';
      }
      in_RSI->pPrior = (Select *)0x0;
      pEVar15 = in_RSI->pLimit;
      in_RSI->pLimit = (Expr *)0x0;
      pcVar11 = selectOpName((uint)in_RSI->op);
      sqlite3VdbeExplain(in_RDI,'\x01',"%s USING TEMP B-TREE",pcVar11);
      local_24 = sqlite3Select((Parse *)pDest,in_stack_00000150,(SelectDest *)pPrior);
      sqlite3ExprListDelete
                ((sqlite3 *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                 (ExprList *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      in_RSI->pPrior = pSVar2;
      in_RSI->pOrderBy = (ExprList *)0x0;
      if (in_RSI->op == '{') {
        LVar5 = sqlite3LogEstAdd(in_RSI->nSelectRow,pSVar2->nSelectRow);
        in_RSI->nSelectRow = LVar5;
      }
      sqlite3ExprDelete((sqlite3 *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                        (Expr *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      in_RSI->pLimit = pEVar15;
      in_RSI->iLimit = 0;
      in_RSI->iOffset = 0;
      if ((byte)local_58 != eDest) {
        iVar6 = sqlite3VdbeMakeLabel
                          ((Vdbe *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
        iVar9 = sqlite3VdbeMakeLabel
                          ((Vdbe *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
        computeLimitRegisters
                  ((Parse *)CONCAT44(uVar7,in_stack_fffffffffffffec0),(Select *)in_RDI,
                   (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
        sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                          in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88,0);
        in_stack_fffffffffffffe90 = iVar6;
        in_stack_fffffffffffffe88 = iVar9;
        iVar8 = sqlite3VdbeCurrentAddr((Vdbe *)pParse_00);
        iVar6 = in_stack_fffffffffffffe90;
        iVar9 = in_stack_fffffffffffffe88;
        selectInnerLoop((Parse *)CONCAT71(in_stack_ffffffffffffff51,local_75),
                        (Select *)CONCAT44(in_stack_fffffffffffffe88,in_stack_fffffffffffffe90),
                        iVar8,(SortCtx *)
                              CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                        (DistinctCtx *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30)
                        ,(SelectDest *)in_stack_ffffffffffffff28,in_stack_ffffffffffffff60,
                        in_stack_ffffffffffffff68);
        sqlite3VdbeResolveLabel((Vdbe *)pParse_00,iVar9);
        sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                          in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88,0);
        sqlite3VdbeResolveLabel((Vdbe *)pParse_00,iVar6);
        sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                          in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88,0);
      }
    }
    else if (uVar7 == 0x7c) {
      iVar6 = 0;
      pSVar2->iLimit = in_RSI->iLimit;
      pSVar2->iOffset = in_RSI->iOffset;
      pSVar2->pLimit = in_RSI->pLimit;
      local_24 = sqlite3Select((Parse *)pDest,in_stack_00000150,(SelectDest *)pPrior);
      in_RSI->pLimit = (Expr *)0x0;
      if (local_24 != 0) goto LAB_001b31c7;
      in_RSI->pPrior = (Select *)0x0;
      in_RSI->iLimit = pSVar2->iLimit;
      in_RSI->iOffset = pSVar2->iOffset;
      if ((in_RSI->iLimit != 0) &&
         (iVar6 = sqlite3VdbeAddOp1((Vdbe *)CONCAT44(in_stack_fffffffffffffe94,
                                                     in_stack_fffffffffffffe90),
                                    in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
         in_RSI->iOffset != 0)) {
        sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                          (int)((ulong)in_stack_fffffffffffffea0 >> 0x20),
                          (int)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                          in_stack_fffffffffffffe98);
      }
      sqlite3VdbeExplain(in_RDI,'\x01',"UNION ALL");
      local_24 = sqlite3Select((Parse *)pDest,in_stack_00000150,(SelectDest *)pPrior);
      in_RSI->pPrior = pSVar2;
      LVar5 = sqlite3LogEstAdd(in_RSI->nSelectRow,pSVar2->nSelectRow);
      in_RSI->nSelectRow = LVar5;
      if (((pSVar2->pLimit != (Expr *)0x0) &&
          (iVar9 = sqlite3ExprIsInteger
                             ((Expr *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                              (int *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90)),
          iVar9 != 0)) && (0 < in_stack_ffffffffffffff90)) {
        iVar9 = (int)in_RSI->nSelectRow;
        LVar5 = sqlite3LogEst((long)in_stack_ffffffffffffff90);
        if (LVar5 < iVar9) {
          LVar5 = sqlite3LogEst((long)in_stack_ffffffffffffff90);
          in_RSI->nSelectRow = LVar5;
        }
      }
      if (iVar6 != 0) {
        sqlite3VdbeJumpHere((Vdbe *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                            in_stack_fffffffffffffe8c);
      }
    }
    else {
      if (uVar7 == 0x7d) goto LAB_001b288e;
      iVar6 = in_RDI->nTab;
      in_RDI->nTab = iVar6 + 1;
      iVar9 = in_RDI->nTab;
      in_RDI->nTab = iVar9 + 1;
      iVar8 = sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90
                                                ),in_stack_fffffffffffffe8c,
                                in_stack_fffffffffffffe88,0);
      in_RSI->addrOpenEphm[0] = iVar8;
      pSVar13 = findRightmost(in_RSI);
      pSVar13->selFlags = pSVar13->selFlags | 0x20;
      sqlite3SelectDestInit(&local_100,1,iVar6);
      local_24 = sqlite3Select((Parse *)pDest,in_stack_00000150,(SelectDest *)pPrior);
      if (local_24 != 0) goto LAB_001b31c7;
      local_100.iSDParm = iVar9;
      iVar6 = sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90
                                                ),in_stack_fffffffffffffe8c,
                                in_stack_fffffffffffffe88,0);
      in_RSI->addrOpenEphm[1] = iVar6;
      in_RSI->pPrior = (Select *)0x0;
      pEVar15 = in_RSI->pLimit;
      in_RSI->pLimit = (Expr *)0x0;
      in_stack_fffffffffffffeb0 = in_RDI;
      iVar6 = local_100.iSDParm;
      pcVar11 = selectOpName((uint)in_RSI->op);
      sqlite3VdbeExplain(in_stack_fffffffffffffeb0,'\x01',"%s USING TEMP B-TREE",pcVar11);
      local_24 = sqlite3Select((Parse *)pDest,in_stack_00000150,(SelectDest *)pPrior);
      in_RSI->pPrior = pSVar2;
      if (pSVar2->nSelectRow < in_RSI->nSelectRow) {
        in_RSI->nSelectRow = pSVar2->nSelectRow;
      }
      sqlite3ExprDelete((sqlite3 *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                        (Expr *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      in_RSI->pLimit = pEVar15;
      iVar9 = sqlite3VdbeMakeLabel
                        ((Vdbe *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
      iVar8 = sqlite3VdbeMakeLabel
                        ((Vdbe *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
      computeLimitRegisters
                ((Parse *)CONCAT44(uVar7,in_stack_fffffffffffffec0),in_stack_fffffffffffffeb8,
                 (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
      sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                        in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88,0);
      iReg = sqlite3GetTempReg(in_RDI);
      iVar10 = sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_fffffffffffffe94,
                                                  in_stack_fffffffffffffe90),
                                 in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88,0);
      sqlite3VdbeAddOp4Int
                ((Vdbe *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                 in_stack_fffffffffffffe98,in_stack_fffffffffffffe94,in_stack_fffffffffffffe90,
                 in_stack_fffffffffffffe8c);
      in_stack_fffffffffffffe90 = iVar9;
      in_stack_fffffffffffffe88 = iVar8;
      sqlite3ReleaseTempReg(in_RDI,iReg);
      iVar9 = in_stack_fffffffffffffe90;
      iVar8 = in_stack_fffffffffffffe88;
      selectInnerLoop((Parse *)CONCAT71(in_stack_ffffffffffffff51,in_stack_ffffffffffffff50),
                      (Select *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                      in_stack_ffffffffffffff44,(SortCtx *)CONCAT44(iVar6,in_stack_fffffffffffffe88)
                      ,(DistinctCtx *)CONCAT44(in_stack_fffffffffffffe90,iVar10),
                      (SelectDest *)pEVar15,in_stack_ffffffffffffff60,in_stack_ffffffffffffff68);
      sqlite3VdbeResolveLabel((Vdbe *)pParse_00,iVar8);
      sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                        in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88,0);
      sqlite3VdbeResolveLabel((Vdbe *)pParse_00,iVar9);
      sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                        in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88,0);
      sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                        in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88,0);
    }
    if (in_RSI->pNext == (Select *)0x0) {
      sqlite3VdbeExplainPop((Parse *)0x1b3013);
    }
  }
  else {
    generateWithRecursiveQuery
              ((Parse *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               in_stack_ffffffffffffff28,
               (SelectDest *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  }
  if ((in_RSI->selFlags & 0x20) != 0) {
    iVar6 = in_RSI->pEList->nExpr;
    p_00 = sqlite3KeyInfoAlloc(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                               in_stack_fffffffffffffe98);
    if (p_00 == (KeyInfo *)0x0) {
      local_24 = 7;
    }
    else {
      local_120 = p_00->aColl;
      for (local_108 = 0; local_118 = in_RSI, local_108 < iVar6; local_108 = local_108 + 1) {
        pCVar14 = multiSelectCollSeq((Parse *)in_stack_fffffffffffffea0,
                                     (Select *)
                                     CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                                     in_stack_fffffffffffffe94);
        *local_120 = pCVar14;
        if (*local_120 == (CollSeq *)0x0) {
          *local_120 = psVar1->pDfltColl;
        }
        local_120 = local_120 + 1;
      }
      for (; local_118 != (Select *)0x0; local_118 = local_118->pPrior) {
        for (local_108 = 0;
            (local_108 < 2 && (iVar6 = local_118->addrOpenEphm[local_108], -1 < iVar6));
            local_108 = local_108 + 1) {
          sqlite3VdbeChangeP2((Vdbe *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                              in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88);
          pPVar16 = pParse_00;
          sqlite3KeyInfoRef(p_00);
          sqlite3VdbeChangeP4((Vdbe *)in_stack_fffffffffffffeb0,iVar6,(char *)pParse_00,
                              in_stack_fffffffffffffe9c);
          local_118->addrOpenEphm[local_108] = -1;
          pParse_00 = pPVar16;
        }
      }
      sqlite3KeyInfoUnref((KeyInfo *)0x1b31c5);
    }
  }
LAB_001b31c7:
  local_50 = (undefined4)uVar3;
  *(undefined4 *)(in_RDX + 1) = local_50;
  uStack_4c = (undefined4)((ulong)uVar3 >> 0x20);
  *(undefined4 *)((long)in_RDX + 0xc) = uStack_4c;
  sqlite3SelectDelete((sqlite3 *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                      (Select *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  return local_24;
}

Assistant:

static int multiSelect(
  Parse *pParse,        /* Parsing context */
  Select *p,            /* The right-most of SELECTs to be coded */
  SelectDest *pDest     /* What to do with query results */
){
  int rc = SQLITE_OK;   /* Success code from a subroutine */
  Select *pPrior;       /* Another SELECT immediately to our left */
  Vdbe *v;              /* Generate code to this VDBE */
  SelectDest dest;      /* Alternative data destination */
  Select *pDelete = 0;  /* Chain of simple selects to delete */
  sqlite3 *db;          /* Database connection */

  /* Make sure there is no ORDER BY or LIMIT clause on prior SELECTs.  Only
  ** the last (right-most) SELECT in the series may have an ORDER BY or LIMIT.
  */
  assert( p && p->pPrior );  /* Calling function guarantees this much */
  assert( (p->selFlags & SF_Recursive)==0 || p->op==TK_ALL || p->op==TK_UNION );
  db = pParse->db;
  pPrior = p->pPrior;
  dest = *pDest;
  if( pPrior->pOrderBy || pPrior->pLimit ){
    sqlite3ErrorMsg(pParse,"%s clause should come after %s not before",
      pPrior->pOrderBy!=0 ? "ORDER BY" : "LIMIT", selectOpName(p->op));
    rc = 1;
    goto multi_select_end;
  }

  v = sqlite3GetVdbe(pParse);
  assert( v!=0 );  /* The VDBE already created by calling function */

  /* Create the destination temporary table if necessary
  */
  if( dest.eDest==SRT_EphemTab ){
    assert( p->pEList );
    sqlite3VdbeAddOp2(v, OP_OpenEphemeral, dest.iSDParm, p->pEList->nExpr);
    dest.eDest = SRT_Table;
  }

  /* Special handling for a compound-select that originates as a VALUES clause.
  */
  if( p->selFlags & SF_MultiValue ){
    rc = multiSelectValues(pParse, p, &dest);
    goto multi_select_end;
  }

  /* Make sure all SELECTs in the statement have the same number of elements
  ** in their result sets.
  */
  assert( p->pEList && pPrior->pEList );
  assert( p->pEList->nExpr==pPrior->pEList->nExpr );

#ifndef SQLITE_OMIT_CTE
  if( p->selFlags & SF_Recursive ){
    generateWithRecursiveQuery(pParse, p, &dest);
  }else
#endif

  /* Compound SELECTs that have an ORDER BY clause are handled separately.
  */
  if( p->pOrderBy ){
    return multiSelectOrderBy(pParse, p, pDest);
  }else{

#ifndef SQLITE_OMIT_EXPLAIN
    if( pPrior->pPrior==0 ){
      ExplainQueryPlan((pParse, 1, "COMPOUND QUERY"));
      ExplainQueryPlan((pParse, 1, "LEFT-MOST SUBQUERY"));
    }
#endif

    /* Generate code for the left and right SELECT statements.
    */
    switch( p->op ){
      case TK_ALL: {
        int addr = 0;
        int nLimit;
        assert( !pPrior->pLimit );
        pPrior->iLimit = p->iLimit;
        pPrior->iOffset = p->iOffset;
        pPrior->pLimit = p->pLimit;
        rc = sqlite3Select(pParse, pPrior, &dest);
        p->pLimit = 0;
        if( rc ){
          goto multi_select_end;
        }
        p->pPrior = 0;
        p->iLimit = pPrior->iLimit;
        p->iOffset = pPrior->iOffset;
        if( p->iLimit ){
          addr = sqlite3VdbeAddOp1(v, OP_IfNot, p->iLimit); VdbeCoverage(v);
          VdbeComment((v, "Jump ahead if LIMIT reached"));
          if( p->iOffset ){
            sqlite3VdbeAddOp3(v, OP_OffsetLimit,
                              p->iLimit, p->iOffset+1, p->iOffset);
          }
        }
        ExplainQueryPlan((pParse, 1, "UNION ALL"));
        rc = sqlite3Select(pParse, p, &dest);
        testcase( rc!=SQLITE_OK );
        pDelete = p->pPrior;
        p->pPrior = pPrior;
        p->nSelectRow = sqlite3LogEstAdd(p->nSelectRow, pPrior->nSelectRow);
        if( pPrior->pLimit
         && sqlite3ExprIsInteger(pPrior->pLimit->pLeft, &nLimit)
         && nLimit>0 && p->nSelectRow > sqlite3LogEst((u64)nLimit) 
        ){
          p->nSelectRow = sqlite3LogEst((u64)nLimit);
        }
        if( addr ){
          sqlite3VdbeJumpHere(v, addr);
        }
        break;
      }
      case TK_EXCEPT:
      case TK_UNION: {
        int unionTab;    /* Cursor number of the temp table holding result */
        u8 op = 0;       /* One of the SRT_ operations to apply to self */
        int priorOp;     /* The SRT_ operation to apply to prior selects */
        Expr *pLimit;    /* Saved values of p->nLimit  */
        int addr;
        SelectDest uniondest;
  
        testcase( p->op==TK_EXCEPT );
        testcase( p->op==TK_UNION );
        priorOp = SRT_Union;
        if( dest.eDest==priorOp ){
          /* We can reuse a temporary table generated by a SELECT to our
          ** right.
          */
          assert( p->pLimit==0 );      /* Not allowed on leftward elements */
          unionTab = dest.iSDParm;
        }else{
          /* We will need to create our own temporary table to hold the
          ** intermediate results.
          */
          unionTab = pParse->nTab++;
          assert( p->pOrderBy==0 );
          addr = sqlite3VdbeAddOp2(v, OP_OpenEphemeral, unionTab, 0);
          assert( p->addrOpenEphm[0] == -1 );
          p->addrOpenEphm[0] = addr;
          findRightmost(p)->selFlags |= SF_UsesEphemeral;
          assert( p->pEList );
        }
  
        /* Code the SELECT statements to our left
        */
        assert( !pPrior->pOrderBy );
        sqlite3SelectDestInit(&uniondest, priorOp, unionTab);
        rc = sqlite3Select(pParse, pPrior, &uniondest);
        if( rc ){
          goto multi_select_end;
        }
  
        /* Code the current SELECT statement
        */
        if( p->op==TK_EXCEPT ){
          op = SRT_Except;
        }else{
          assert( p->op==TK_UNION );
          op = SRT_Union;
        }
        p->pPrior = 0;
        pLimit = p->pLimit;
        p->pLimit = 0;
        uniondest.eDest = op;
        ExplainQueryPlan((pParse, 1, "%s USING TEMP B-TREE",
                          selectOpName(p->op)));
        rc = sqlite3Select(pParse, p, &uniondest);
        testcase( rc!=SQLITE_OK );
        /* Query flattening in sqlite3Select() might refill p->pOrderBy.
        ** Be sure to delete p->pOrderBy, therefore, to avoid a memory leak. */
        sqlite3ExprListDelete(db, p->pOrderBy);
        pDelete = p->pPrior;
        p->pPrior = pPrior;
        p->pOrderBy = 0;
        if( p->op==TK_UNION ){
          p->nSelectRow = sqlite3LogEstAdd(p->nSelectRow, pPrior->nSelectRow);
        }
        sqlite3ExprDelete(db, p->pLimit);
        p->pLimit = pLimit;
        p->iLimit = 0;
        p->iOffset = 0;
  
        /* Convert the data in the temporary table into whatever form
        ** it is that we currently need.
        */
        assert( unionTab==dest.iSDParm || dest.eDest!=priorOp );
        if( dest.eDest!=priorOp ){
          int iCont, iBreak, iStart;
          assert( p->pEList );
          iBreak = sqlite3VdbeMakeLabel(v);
          iCont = sqlite3VdbeMakeLabel(v);
          computeLimitRegisters(pParse, p, iBreak);
          sqlite3VdbeAddOp2(v, OP_Rewind, unionTab, iBreak); VdbeCoverage(v);
          iStart = sqlite3VdbeCurrentAddr(v);
          selectInnerLoop(pParse, p, unionTab,
                          0, 0, &dest, iCont, iBreak);
          sqlite3VdbeResolveLabel(v, iCont);
          sqlite3VdbeAddOp2(v, OP_Next, unionTab, iStart); VdbeCoverage(v);
          sqlite3VdbeResolveLabel(v, iBreak);
          sqlite3VdbeAddOp2(v, OP_Close, unionTab, 0);
        }
        break;
      }
      default: assert( p->op==TK_INTERSECT ); {
        int tab1, tab2;
        int iCont, iBreak, iStart;
        Expr *pLimit;
        int addr;
        SelectDest intersectdest;
        int r1;
  
        /* INTERSECT is different from the others since it requires
        ** two temporary tables.  Hence it has its own case.  Begin
        ** by allocating the tables we will need.
        */
        tab1 = pParse->nTab++;
        tab2 = pParse->nTab++;
        assert( p->pOrderBy==0 );
  
        addr = sqlite3VdbeAddOp2(v, OP_OpenEphemeral, tab1, 0);
        assert( p->addrOpenEphm[0] == -1 );
        p->addrOpenEphm[0] = addr;
        findRightmost(p)->selFlags |= SF_UsesEphemeral;
        assert( p->pEList );
  
        /* Code the SELECTs to our left into temporary table "tab1".
        */
        sqlite3SelectDestInit(&intersectdest, SRT_Union, tab1);
        rc = sqlite3Select(pParse, pPrior, &intersectdest);
        if( rc ){
          goto multi_select_end;
        }
  
        /* Code the current SELECT into temporary table "tab2"
        */
        addr = sqlite3VdbeAddOp2(v, OP_OpenEphemeral, tab2, 0);
        assert( p->addrOpenEphm[1] == -1 );
        p->addrOpenEphm[1] = addr;
        p->pPrior = 0;
        pLimit = p->pLimit;
        p->pLimit = 0;
        intersectdest.iSDParm = tab2;
        ExplainQueryPlan((pParse, 1, "%s USING TEMP B-TREE",
                          selectOpName(p->op)));
        rc = sqlite3Select(pParse, p, &intersectdest);
        testcase( rc!=SQLITE_OK );
        pDelete = p->pPrior;
        p->pPrior = pPrior;
        if( p->nSelectRow>pPrior->nSelectRow ){
          p->nSelectRow = pPrior->nSelectRow;
        }
        sqlite3ExprDelete(db, p->pLimit);
        p->pLimit = pLimit;
  
        /* Generate code to take the intersection of the two temporary
        ** tables.
        */
        assert( p->pEList );
        iBreak = sqlite3VdbeMakeLabel(v);
        iCont = sqlite3VdbeMakeLabel(v);
        computeLimitRegisters(pParse, p, iBreak);
        sqlite3VdbeAddOp2(v, OP_Rewind, tab1, iBreak); VdbeCoverage(v);
        r1 = sqlite3GetTempReg(pParse);
        iStart = sqlite3VdbeAddOp2(v, OP_RowData, tab1, r1);
        sqlite3VdbeAddOp4Int(v, OP_NotFound, tab2, iCont, r1, 0);
        VdbeCoverage(v);
        sqlite3ReleaseTempReg(pParse, r1);
        selectInnerLoop(pParse, p, tab1,
                        0, 0, &dest, iCont, iBreak);
        sqlite3VdbeResolveLabel(v, iCont);
        sqlite3VdbeAddOp2(v, OP_Next, tab1, iStart); VdbeCoverage(v);
        sqlite3VdbeResolveLabel(v, iBreak);
        sqlite3VdbeAddOp2(v, OP_Close, tab2, 0);
        sqlite3VdbeAddOp2(v, OP_Close, tab1, 0);
        break;
      }
    }
  
  #ifndef SQLITE_OMIT_EXPLAIN
    if( p->pNext==0 ){
      ExplainQueryPlanPop(pParse);
    }
  #endif
  }
  
  /* Compute collating sequences used by 
  ** temporary tables needed to implement the compound select.
  ** Attach the KeyInfo structure to all temporary tables.
  **
  ** This section is run by the right-most SELECT statement only.
  ** SELECT statements to the left always skip this part.  The right-most
  ** SELECT might also skip this part if it has no ORDER BY clause and
  ** no temp tables are required.
  */
  if( p->selFlags & SF_UsesEphemeral ){
    int i;                        /* Loop counter */
    KeyInfo *pKeyInfo;            /* Collating sequence for the result set */
    Select *pLoop;                /* For looping through SELECT statements */
    CollSeq **apColl;             /* For looping through pKeyInfo->aColl[] */
    int nCol;                     /* Number of columns in result set */

    assert( p->pNext==0 );
    nCol = p->pEList->nExpr;
    pKeyInfo = sqlite3KeyInfoAlloc(db, nCol, 1);
    if( !pKeyInfo ){
      rc = SQLITE_NOMEM_BKPT;
      goto multi_select_end;
    }
    for(i=0, apColl=pKeyInfo->aColl; i<nCol; i++, apColl++){
      *apColl = multiSelectCollSeq(pParse, p, i);
      if( 0==*apColl ){
        *apColl = db->pDfltColl;
      }
    }

    for(pLoop=p; pLoop; pLoop=pLoop->pPrior){
      for(i=0; i<2; i++){
        int addr = pLoop->addrOpenEphm[i];
        if( addr<0 ){
          /* If [0] is unused then [1] is also unused.  So we can
          ** always safely abort as soon as the first unused slot is found */
          assert( pLoop->addrOpenEphm[1]<0 );
          break;
        }
        sqlite3VdbeChangeP2(v, addr, nCol);
        sqlite3VdbeChangeP4(v, addr, (char*)sqlite3KeyInfoRef(pKeyInfo),
                            P4_KEYINFO);
        pLoop->addrOpenEphm[i] = -1;
      }
    }
    sqlite3KeyInfoUnref(pKeyInfo);
  }

multi_select_end:
  pDest->iSdst = dest.iSdst;
  pDest->nSdst = dest.nSdst;
  sqlite3SelectDelete(db, pDelete);
  return rc;
}